

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,_ft::allocator<int>_>::list<int>
          (list<int,_ft::allocator<int>_> *this,int first,int last,allocator_type *alloc)

{
  value_type local_24 [2];
  int last_local;
  
  this->m_head = (node *)0x0;
  this->m_tail = (node *)0x0;
  this->m_size = 0;
  listInit(this);
  assign(this,(long)first,local_24);
  return;
}

Assistant:

list(Iterator first, Iterator last,
	  allocator_type const & alloc = allocator_type()):
	 	m_head(NULL),
	 	m_tail(NULL),
	 	m_size(0),
	 	m_alloc(alloc) {
		this->listInit();
		this->assign(first, last);
	}